

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-solver.cc
# Opt level: O2

void __thiscall
mp::NLFeeder_Easy::
FeedVarBounds<mp::NLWriter2<mp::NLWriter2Params<mp::TextFormatter,mp::NLFeeder_Easy>>::VarBndWriter>
          (NLFeeder_Easy *this,VarBndWriter *vbw)

{
  int iVar1;
  double *pdVar2;
  double *pdVar3;
  int i;
  long lVar4;
  
  pdVar2 = (this->nlme_).vars_.lower_;
  pdVar3 = (this->nlme_).vars_.upper_;
  for (lVar4 = 0; lVar4 < (this->header_).super_NLProblemInfo.super_NLProblemInfo_C.num_vars;
      lVar4 = lVar4 + 1) {
    iVar1 = (this->var_perm_).
            super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
            super__Vector_impl_data._M_start[lVar4].second;
    NLWriter2<mp::NLWriter2Params<mp::TextFormatter,_mp::NLFeeder_Easy>_>::VarBndWriter::WriteLbUb
              (vbw,pdVar2[iVar1],pdVar3[iVar1]);
  }
  return;
}

Assistant:

void FeedVarBounds(VarBoundsWriter& vbw) {
    auto vars = NLME().ColData();
    for (int i = 0; i < header_.num_vars; i++)
      vbw.WriteLbUb(vars.lower_[VPermInv(i)],
                    vars.upper_[VPermInv(i)]);
  }